

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O2

void TasGrid::RuleLocal::van_matrix<(TasGrid::RuleLocal::erule)2>
               (int max_order,int num_rows,vector<int,_std::allocator<int>_> *pntr,
               vector<int,_std::allocator<int>_> *indx,vector<double,_std::allocator<double>_> *vals
               )

{
  pointer pdVar1;
  double x;
  vector<int,std::allocator<int>> *this;
  int iVar2;
  pointer *ppiVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  double local_e0;
  int local_d4;
  vector<int,std::allocator<int>> *local_d0;
  vector<int,std::allocator<int>> *local_c8;
  int local_bc;
  value_type_conflict3 i;
  undefined4 uStack_b4;
  undefined1 auStack_b0 [8];
  pointer local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined1 local_90 [8];
  vector<double,_std::allocator<double>_> ancestors_vals;
  reverse_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_50;
  reverse_iterator<__gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_40;
  reverse_iterator<__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>_>
  local_38;
  
  local_d0 = (vector<int,std::allocator<int>> *)pntr;
  local_c8 = (vector<int,std::allocator<int>> *)indx;
  iVar2 = getLevel<(TasGrid::RuleLocal::erule)2>(num_rows);
  if (num_rows == 2) {
    _i = (pointer)0x0;
    auStack_b0 = (undefined1  [8])0x1;
    local_a8 = (pointer)CONCAT44(local_a8._4_4_,2);
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>(local_c8,&i);
    local_a8 = (pointer)0x3ff0000000000000;
    uStack_a0 = 0x3ff0000000000000;
    _i = (pointer)0x3ff0000000000000;
    auStack_b0 = (undefined1  [8])0x3ff0000000000000;
    local_98 = 0x3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&i,local_90);
    auStack_b0 = (undefined1  [8])0x500000003;
    ppiVar3 = &local_a8;
  }
  else if (num_rows == 1) {
    _i = (pointer)0x0;
    auStack_b0._0_4_ = 1;
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>(local_c8,&i);
    _i = (pointer)0x3ff0000000000000;
    auStack_b0._0_4_ = 0;
    auStack_b0._4_4_ = 0x3ff00000;
    local_a8 = (pointer)0x3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&i,&uStack_a0);
    auStack_b0._0_4_ = 3;
    ppiVar3 = (pointer *)(auStack_b0 + 4);
  }
  else {
    if (num_rows != 0) {
      if (*(long *)(local_c8 + 8) != *(long *)local_c8) {
        *(long *)(local_c8 + 8) = *(long *)local_c8;
      }
      ::std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)local_c8,(long)(iVar2 * num_rows));
      pdVar1 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish != pdVar1) {
        (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = pdVar1;
      }
      ::std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)vals,(long)(iVar2 * num_rows));
      ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((ulong)ancestors_vals.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
      ::std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&i,(long)(num_rows + 1),
                 (value_type_conflict3 *)&ancestors_vals,(allocator_type *)&local_e0);
      ::std::vector<int,_std::allocator<int>_>::_M_move_assign
                ((vector<int,_std::allocator<int>_> *)local_d0,
                 (_Vector_base<int,_std::allocator<int>_> *)&i);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&i);
      for (lVar5 = 0; lVar5 != 0x14; lVar5 = lVar5 + 4) {
        _i = (int *)CONCAT44(uStack_b4,*(undefined4 *)((long)&DAT_001d2948 + lVar5));
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_c8,&i);
      }
      iVar4 = 5;
      while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
        _i = (pointer)0x3ff0000000000000;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(vals,(double *)&i);
      }
      *(undefined8 *)(*(long *)local_d0 + 4) = 0x300000001;
      _i = (pointer)0x0;
      auStack_b0 = (undefined1  [8])0x0;
      local_a8 = (pointer)0x0;
      ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ::std::vector<int,_std::allocator<int>_>::reserve
                ((vector<int,_std::allocator<int>_> *)&i,(long)iVar2);
      ::std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)&ancestors_vals,(long)iVar2);
      for (local_d4 = 3; this = local_c8, local_d4 < num_rows; local_d4 = local_d4 + 1) {
        *(int *)(*(long *)local_d0 + (long)local_d4 * 4) =
             (int)((ulong)(*(long *)(local_c8 + 8) - *(long *)local_c8) >> 2);
        x = getNode<(TasGrid::RuleLocal::erule)2>(local_d4);
        if (auStack_b0 != (undefined1  [8])_i) {
          auStack_b0 = (undefined1  [8])_i;
        }
        local_bc = local_d4;
        if (ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start) {
          ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
        }
        while (iVar2 = (local_bc + 1) / 2, 4 < local_bc) {
          local_bc = iVar2;
          ::std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)&i,&local_bc);
          local_e0 = evalRaw<(TasGrid::RuleLocal::erule)2>(max_order,local_bc,x);
          std::vector<double,_std::allocator<double>_>::emplace_back<double>
                    (&ancestors_vals,&local_e0);
        }
        local_e0 = (double)((ulong)local_e0 & 0xffffffff00000000);
        local_bc = iVar2;
        ::std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)this,(int *)&local_e0);
        local_e0._0_4_ = 1;
        ::std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)this,(int *)&local_e0);
        local_e0 = (double)CONCAT44(local_e0._4_4_,2);
        ::std::vector<int,_std::allocator<int>_>::emplace_back<int>
                  ((vector<int,_std::allocator<int>_> *)this,(int *)&local_e0);
        local_38.current._M_current =
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)auStack_b0;
        local_40.current._M_current =
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)_i;
        ::std::vector<int,std::allocator<int>>::
        insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>,void>
                  (this,(const_iterator)*(int **)(this + 8),&local_38,&local_40);
        ::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)this,&local_d4);
        local_e0 = 1.0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(vals,&local_e0);
        local_e0 = (x + -1.0) * x * 0.5;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(vals,&local_e0);
        local_e0 = x * 0.5 * (x + 1.0);
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(vals,&local_e0);
        local_48.current._M_current =
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_50.current._M_current =
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             ancestors_vals.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        ::std::vector<double,std::allocator<double>>::
        insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>,void>
                  ((vector<double,std::allocator<double>> *)vals,
                   (const_iterator)
                   (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish,&local_48,&local_50);
        local_e0 = 1.0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(vals,&local_e0);
      }
      *(int *)(*(long *)(local_d0 + 8) + -4) =
           (int)((ulong)(*(long *)(local_c8 + 8) - *(long *)local_c8) >> 2);
      ::std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)&ancestors_vals);
      ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&i);
      return;
    }
    _i = _i & 0xffffffff00000000;
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>(local_c8,&i);
    _i = (pointer)0x3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&i,auStack_b0);
    ppiVar3 = (pointer *)auStack_b0;
  }
  _i = (pointer)0x100000000;
  ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>(local_d0,&i,ppiVar3);
  return;
}

Assistant:

void van_matrix(int max_order, int num_rows, std::vector<int> &pntr, std::vector<int> &indx, std::vector<double> &vals) {
        int max_level = getLevel<effrule>(num_rows);

        if (effrule == erule::pwc) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 0, 1};
                    vals = {1.0, 1.0, 1.0};
                    pntr = {0, 1, 3};
                    break;
                case 2:
                    indx = {0, 0, 1, 0, 2};
                    vals = {1.0, 1.0, 1.0, 1.0, 1.0};
                    pntr = {0, 1, 3, 5};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    for(auto i : std::array<int, 5>{0, 0, 1, 0, 2})
                        indx.push_back(i);
                    for(size_t i=0; i<5; i++)
                        vals.push_back(1.0);
                    pntr[1] = 1;
                    pntr[2] = 3;
                    {
                        std::vector<int> ancestors;
                        ancestors.reserve(max_level);
                        for(int r=3; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            int kid = r;
                            int dad = kid / 3;
                            while(dad != 0) {
                                if (dad % 2 == 0) {
                                    if (kid != 3 * dad)
                                        ancestors.push_back(dad);
                                } else {
                                    if (kid != 3 * dad + 2)
                                        ancestors.push_back(dad);
                                }
                                kid = dad;
                                dad = kid / 3;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            for(size_t i=0; i<ancestors.size() + 2; i++)
                                vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::localp) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    vals.push_back(1.0);
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=1; r<num_rows; r++) {
                            double x = getNode<effrule>(r);
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            if (kid < 4) dad--;
                            while(dad != 0) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                                if (kid < 4) dad--;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back(1.0);
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::semilocalp) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 0, 1};
                    vals = {1.0, 1.0, 1.0};
                    pntr = {0, 1, 3};
                    break;
                case 2:
                    indx = {0, 0, 1, 0, 2};
                    vals = {1.0, 1.0, 1.0, 1.0, 1.0};
                    pntr = {0, 1, 3, 5};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    for(auto i : std::array<int, 5>{0, 0, 1, 0, 2})
                        indx.push_back(i);
                    for(int i=0; i<5; i++)
                        vals.push_back(1.0);
                    pntr[1] = 1;
                    pntr[2] = 3;
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=3; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            double x = getNode<effrule>(r);
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            while(dad > 2) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                            }
                            indx.push_back(0);
                            indx.push_back(1);
                            indx.push_back(2);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back(1.0);
                            vals.push_back( evalRaw<effrule>(max_order, 1, x) );
                            vals.push_back( evalRaw<effrule>(max_order, 2, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::localp0) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    vals.push_back(1.0);
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=1; r<num_rows; r++) {
                            double x = getNode<effrule>(r);
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid - 1) / 2;
                            while(dad != 0) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid - 1) / 2;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back( evalRaw<effrule>(max_order, 0, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else { // if (effrule == erule::localpb) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 1};
                    vals = {1.0, 1.0};
                    pntr = {0, 1, 2};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    indx.push_back(1);
                    vals.push_back(1.0);
                    vals.push_back(1.0);
                    pntr[1] = 1;
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=2; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            double x = getNode<effrule>(r);
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            while(dad > 1) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                            }
                            indx.push_back(0);
                            indx.push_back(1);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back( evalRaw<effrule>(max_order, 0, x) );
                            vals.push_back( evalRaw<effrule>(max_order, 1, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        }
    }